

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

optional<std::__cxx11::string> * __thiscall
nonstd::optional_lite::optional<std::__cxx11::string>::value_or<char_const(&)[2]>
          (optional<std::__cxx11::string> *this,char (*v) [2])

{
  value_type *pvVar1;
  char *in_RDX;
  bool local_96;
  allocator local_81;
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  char *local_20;
  char (*v_local) [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_20 = in_RDX;
  v_local = v;
  this_local = (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this;
  local_96 = optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::has_value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)v);
  if (local_96) {
    pvVar1 = detail::
             storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value((storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(v + 4));
    std::__cxx11::string::string(local_40,(string *)pvVar1);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,local_20,&local_81);
    std::__cxx11::string::string(local_60,local_80);
    std::__cxx11::string::string(local_40,local_60);
  }
  local_96 = !local_96;
  std::__cxx11::string::string((string *)this,local_40);
  std::__cxx11::string::~string(local_40);
  if (local_96) {
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  return this;
}

Assistant:

optional_constexpr value_type value_or( U && v ) const optional_ref_qual
    {
        return has_value() ? contained.value() : static_cast<T>(std::forward<U>( v ) );
    }